

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::TIntermediate::addSelection
          (TIntermediate *this,TIntermTyped *cond,TIntermTyped *trueBlock,TIntermTyped *falseBlock,
          TSourceLoc *loc)

{
  EShSource EVar1;
  ulong uVar2;
  _Head_base<1UL,_glslang::TIntermTyped_*,_false> node2;
  char cVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  TBasicType t;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  TIntermTyped *right_00;
  TIntermTyped *right_01;
  TIntermediate *pTVar7;
  undefined4 extraout_var_09;
  TIntermAggregate *pTVar8;
  TIntermSelection *this_00;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  uint uVar9;
  uint uVar10;
  TIntermNodePair nodePair;
  _Head_base<1UL,_glslang::TIntermTyped_*,_false> local_e8;
  TIntermAggregate *local_e0;
  tuple<glslang::TIntermTyped_*,_glslang::TIntermTyped_*> children;
  TType targetVectorType;
  TType *right;
  undefined4 extraout_var_08;
  
  iVar5 = (*(trueBlock->super_TIntermNode)._vptr_TIntermNode[0x20])(trueBlock);
  if ((iVar5 == 0) &&
     (pTVar7 = (TIntermediate *)falseBlock,
     iVar5 = (*(falseBlock->super_TIntermNode)._vptr_TIntermNode[0x20])(), iVar5 == 0)) {
    nodePair.node2 = &falseBlock->super_TIntermNode;
    nodePair.node1 = &trueBlock->super_TIntermNode;
    this_00 = addSelection(pTVar7,cond,nodePair,loc);
    EVar1 = this->source;
joined_r0x00404e7b:
    if (EVar1 == EShSourceHlsl) {
      this_00->shortCircuit = false;
    }
  }
  else {
    addPairConversion((TIntermediate *)&children,(TOperator)this,(TIntermTyped *)0x1,trueBlock);
    local_e0 = (TIntermAggregate *)
               children.super__Tuple_impl<0UL,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*>.
               super__Head_base<0UL,_glslang::TIntermTyped_*,_false>._M_head_impl;
    local_e8 = children.super__Tuple_impl<0UL,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*>.
               super__Tuple_impl<1UL,_glslang::TIntermTyped_*>.
               super__Head_base<1UL,_glslang::TIntermTyped_*,_false>._M_head_impl;
    if (children.super__Tuple_impl<0UL,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*>.
        super__Tuple_impl<1UL,_glslang::TIntermTyped_*>.
        super__Head_base<1UL,_glslang::TIntermTyped_*,_false>._M_head_impl != (TIntermTyped *)0x0 &&
        children.super__Tuple_impl<0UL,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*>.
        super__Head_base<0UL,_glslang::TIntermTyped_*,_false>._M_head_impl != (TIntermTyped *)0x0) {
      iVar5 = (*(cond->super_TIntermNode)._vptr_TIntermNode[0x1e])(cond);
      cVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 200))
                        ((long *)CONCAT44(extraout_var,iVar5));
      if (cVar3 == '\0') {
        iVar5 = (*((children.
                    super__Tuple_impl<0UL,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*>.
                    super__Head_base<0UL,_glslang::TIntermTyped_*,_false>._M_head_impl)->
                  super_TIntermNode)._vptr_TIntermNode[0x1e])
                          (children.
                           super__Tuple_impl<0UL,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*>.
                           super__Head_base<0UL,_glslang::TIntermTyped_*,_false>._M_head_impl);
        t = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar5) + 0x38))
                      ((long *)CONCAT44(extraout_var_06,iVar5));
        iVar5 = (*(cond->super_TIntermNode)._vptr_TIntermNode[0x1e])();
        iVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar5) + 0x60))
                          ((long *)CONCAT44(extraout_var_07,iVar5));
        TType::TType(&targetVectorType,t,EvqTemporary,iVar5,0,0,false);
        right_00 = addUniShapeConversion
                             (this,EOpMix,&targetVectorType,
                              children.
                              super__Tuple_impl<0UL,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*>
                              .super__Head_base<0UL,_glslang::TIntermTyped_*,_false>._M_head_impl);
        right_01 = addUniShapeConversion
                             (this,EOpMix,&targetVectorType,
                              (TIntermTyped *)
                              children.
                              super__Tuple_impl<0UL,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*>
                              .super__Tuple_impl<1UL,_glslang::TIntermTyped_*>.
                              super__Head_base<1UL,_glslang::TIntermTyped_*,_false>._M_head_impl);
        iVar5 = (*(right_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(right_01);
        pTVar7 = (TIntermediate *)CONCAT44(extraout_var_08,iVar5);
        iVar5 = (*(right_00->super_TIntermNode)._vptr_TIntermNode[0x1e])(right_00);
        bVar4 = TType::operator!=((TType *)pTVar7,(TType *)CONCAT44(extraout_var_09,iVar5));
        if (bVar4) {
          return (TIntermTyped *)0x0;
        }
        pTVar8 = makeAggregate(pTVar7,loc);
        pTVar8 = growAggregate(pTVar7,(TIntermNode *)pTVar8,&right_01->super_TIntermNode);
        pTVar8 = growAggregate(pTVar7,(TIntermNode *)pTVar8,&right_00->super_TIntermNode);
        pTVar8 = growAggregate(pTVar7,(TIntermNode *)pTVar8,&cond->super_TIntermNode);
        (*(pTVar8->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
          [0x1d])(pTVar8,&targetVectorType);
        (pTVar8->super_TIntermOperator).op = EOpMix;
        return (TIntermTyped *)pTVar8;
      }
      addBiShapeConversion(this,EOpMix,(TIntermTyped **)&local_e0,&local_e8._M_head_impl);
      node2._M_head_impl = local_e8._M_head_impl;
      iVar5 = (*((local_e8._M_head_impl)->super_TIntermNode)._vptr_TIntermNode[0x1e])
                        (local_e8._M_head_impl);
      pTVar8 = local_e0;
      iVar6 = (*(local_e0->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x1e])(local_e0);
      right = (TType *)CONCAT44(extraout_var_01,iVar6);
      bVar4 = TType::operator!=((TType *)CONCAT44(extraout_var_00,iVar5),right);
      if (!bVar4) {
        iVar5 = (*(cond->super_TIntermNode)._vptr_TIntermNode[5])(cond);
        if (((CONCAT44(extraout_var_02,iVar5) != 0) &&
            (iVar5 = (*(pTVar8->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                       _vptr_TIntermNode[5])(pTVar8), CONCAT44(extraout_var_03,iVar5) != 0)) &&
           (iVar5 = (*((node2._M_head_impl)->super_TIntermNode)._vptr_TIntermNode[5])
                              (node2._M_head_impl), CONCAT44(extraout_var_04,iVar5) != 0)) {
          iVar5 = (*(cond->super_TIntermNode)._vptr_TIntermNode[5])(cond);
          if (**(char **)(*(long *)(CONCAT44(extraout_var_05,iVar5) + 0xc0) + 8) == '\0') {
            return node2._M_head_impl;
          }
          return (TIntermTyped *)pTVar8;
        }
        this_00 = (TIntermSelection *)TIntermNode::operator_new((TIntermNode *)0xd8,(size_t)right);
        iVar5 = (*(pTVar8->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x1e])(pTVar8);
        TIntermSelection::TIntermSelection
                  (this_00,cond,(TIntermNode *)pTVar8,&(node2._M_head_impl)->super_TIntermNode,
                   (TType *)CONCAT44(extraout_var_10,iVar5));
        (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[1])(this_00,loc);
        iVar5 = (*(pTVar8->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x21])(pTVar8);
        uVar10 = *(uint *)(CONCAT44(extraout_var_11,iVar5) + 8) >> 0x19 & 7;
        iVar5 = (*((node2._M_head_impl)->super_TIntermNode)._vptr_TIntermNode[0x21])
                          (node2._M_head_impl);
        uVar9 = *(uint *)(CONCAT44(extraout_var_12,iVar5) + 8) >> 0x19 & 7;
        if (uVar9 < uVar10) {
          uVar9 = uVar10;
        }
        iVar5 = (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(this_00);
        *(ulong *)(CONCAT44(extraout_var_13,iVar5) + 8) =
             *(ulong *)(CONCAT44(extraout_var_13,iVar5) + 8) & 0xfffffffff1ffffff |
             (ulong)(uVar9 << 0x19);
        pTVar7 = (TIntermediate *)cond;
        iVar5 = (*(cond->super_TIntermNode)._vptr_TIntermNode[0x21])();
        uVar2 = *(ulong *)(CONCAT44(extraout_var_14,iVar5) + 8);
        if ((((uVar2 & 0x10000007f) == 2 || (uVar2 >> 0x20 & 1) != 0) &&
            (bVar4 = specConstantPropagates(pTVar7,(TIntermTyped *)pTVar8,node2._M_head_impl), bVar4
            )) || ((iVar5 = (*(cond->super_TIntermNode)._vptr_TIntermNode[0x21])(cond),
                   (*(ulong *)(CONCAT44(extraout_var_15,iVar5) + 8) & 0x100000000) != 0 &&
                   ((iVar5 = (*(pTVar8->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                               _vptr_TIntermNode[0x21])(pTVar8),
                    uVar2 = *(ulong *)(CONCAT44(extraout_var_16,iVar5) + 8),
                    (uVar2 & 0x10000007f) == 2 || (uVar2 & 0x100000000) != 0 &&
                    (iVar5 = (*((node2._M_head_impl)->super_TIntermNode)._vptr_TIntermNode[0x21])
                                       (node2._M_head_impl),
                    uVar2 = *(ulong *)(CONCAT44(extraout_var_17,iVar5) + 8),
                    (uVar2 & 0x10000007f) == 2 || (uVar2 & 0x100000000) != 0)))))) {
          iVar5 = (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])
                            (this_00);
          *(ulong *)(CONCAT44(extraout_var_18,iVar5) + 8) =
               (*(ulong *)(CONCAT44(extraout_var_18,iVar5) + 8) & 0xfffffffeffffff80) + 0x100000002;
        }
        else {
          iVar5 = (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])
                            (this_00);
          TQualifier::makeTemporary((TQualifier *)CONCAT44(extraout_var_19,iVar5));
        }
        EVar1 = this->source;
        goto joined_r0x00404e7b;
      }
    }
    this_00 = (TIntermSelection *)0x0;
  }
  return &this_00->super_TIntermTyped;
}

Assistant:

TIntermTyped* TIntermediate::addSelection(TIntermTyped* cond, TIntermTyped* trueBlock, TIntermTyped* falseBlock,
                                          const TSourceLoc& loc)
{
    // If it's void, go to the if-then-else selection()
    if (trueBlock->getBasicType() == EbtVoid && falseBlock->getBasicType() == EbtVoid) {
        TIntermNodePair pair = { trueBlock, falseBlock };
        TIntermSelection* selection = addSelection(cond, pair, loc);
        if (getSource() == EShSourceHlsl)
            selection->setNoShortCircuit();

        return selection;
    }

    //
    // Get compatible types.
    //
    auto children = addPairConversion(EOpSequence, trueBlock, falseBlock);
    trueBlock = std::get<0>(children);
    falseBlock = std::get<1>(children);

    if (trueBlock == nullptr || falseBlock == nullptr)
        return nullptr;

    // Handle a vector condition as a mix
    if (!cond->getType().isScalarOrVec1()) {
        TType targetVectorType(trueBlock->getType().getBasicType(), EvqTemporary,
                               cond->getType().getVectorSize());
        // smear true/false operands as needed
        trueBlock = addUniShapeConversion(EOpMix, targetVectorType, trueBlock);
        falseBlock = addUniShapeConversion(EOpMix, targetVectorType, falseBlock);

        // After conversion, types have to match.
        if (falseBlock->getType() != trueBlock->getType())
            return nullptr;

        // make the mix operation
        TIntermAggregate* mix = makeAggregate(loc);
        mix = growAggregate(mix, falseBlock);
        mix = growAggregate(mix, trueBlock);
        mix = growAggregate(mix, cond);
        mix->setType(targetVectorType);
        mix->setOp(EOpMix);

        return mix;
    }

    // Now have a scalar condition...

    // Convert true and false expressions to matching types
    addBiShapeConversion(EOpMix, trueBlock, falseBlock);

    // After conversion, types have to match.
    if (falseBlock->getType() != trueBlock->getType())
        return nullptr;

    // Eliminate the selection when the condition is a scalar and all operands are constant.
    if (cond->getAsConstantUnion() && trueBlock->getAsConstantUnion() && falseBlock->getAsConstantUnion()) {
        if (cond->getAsConstantUnion()->getConstArray()[0].getBConst())
            return trueBlock;
        else
            return falseBlock;
    }

    //
    // Make a selection node.
    //
    TIntermSelection* node = new TIntermSelection(cond, trueBlock, falseBlock, trueBlock->getType());
    node->setLoc(loc);
    node->getQualifier().precision = std::max(trueBlock->getQualifier().precision, falseBlock->getQualifier().precision);

    if ((cond->getQualifier().isConstant() && specConstantPropagates(*trueBlock, *falseBlock)) ||
        (cond->getQualifier().isSpecConstant() && trueBlock->getQualifier().isConstant() &&
                                                 falseBlock->getQualifier().isConstant()))
        node->getQualifier().makeSpecConstant();
    else
        node->getQualifier().makeTemporary();

    if (getSource() == EShSourceHlsl)
        node->setNoShortCircuit();

    return node;
}